

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O2

Result<wasm::Memory_*> * __thiscall
wasm::WATParser::ParseDeclsCtx::addMemoryDecl
          (Result<wasm::Memory_*> *__return_storage_ptr__,ParseDeclsCtx *this,Index pos,Name name,
          ImportNames *importNames,MemType type)

{
  int __val;
  Memory *pMVar1;
  _Variant_storage<false,wasm::Memory*,wasm::Err> *p_Var2;
  char *pcVar3;
  string_view sVar4;
  string local_b8;
  string local_98;
  string_view local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  _Variant_storage<false,wasm::Memory*,wasm::Err> *local_48;
  Index local_3c;
  _Head_base<0UL,_wasm::Memory_*,_false> local_38;
  __single_object m;
  
  local_48 = (_Variant_storage<false,wasm::Memory*,wasm::Err> *)__return_storage_ptr__;
  local_3c = pos;
  std::make_unique<wasm::Memory>();
  ((local_38._M_head_impl)->addressType).id = type.addressType.id;
  ((local_38._M_head_impl)->initial).addr = type.limits.initial;
  if (type.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged == false) {
    type.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 0xffffffffffffffff;
  }
  ((local_38._M_head_impl)->max).addr =
       (address64_t)
       type.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  (local_38._M_head_impl)->shared = type.shared;
  if (name.super_IString.str._M_str == (char *)0x0) {
    __val = this->memoryCounter;
    this->memoryCounter = __val + 1;
    std::__cxx11::to_string(&local_98,__val);
    pcVar3 = "mimport$";
    if (importNames == (ImportNames *)0x0) {
      pcVar3 = "";
    }
    std::operator+(&local_68,pcVar3,&local_98);
    IString::IString((IString *)&local_78,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_98);
    sVar4 = (string_view)Names::getValidMemoryName(this->wasm,(Name)local_78);
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar4;
  }
  else {
    pMVar1 = Module::getMemoryOrNull(this->wasm,name);
    if (pMVar1 != (Memory *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"repeated memory name",(allocator<char> *)&local_98);
      Lexer::err((Err *)&local_68,&this->in,(ulong)local_3c,&local_b8);
      p_Var2 = local_48;
      std::__detail::__variant::_Variant_storage<false,wasm::Memory*,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>(local_48,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_b8);
      goto LAB_00bfe4e8;
    }
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len =
         name.super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
         name.super_IString.str._M_str;
    ((local_38._M_head_impl)->super_Importable).super_Named.hasExplicitName = true;
  }
  if (importNames != (ImportNames *)0x0) {
    pcVar3 = (importNames->mod).super_IString.str._M_str;
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len =
         (importNames->mod).super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = pcVar3;
    pcVar3 = (importNames->nm).super_IString.str._M_str;
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len =
         (importNames->nm).super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str = pcVar3;
  }
  pMVar1 = Module::addMemory(this->wasm,
                             (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                             &local_38);
  *(Memory **)local_48 = pMVar1;
  local_48[0x20] = (_Variant_storage<false,wasm::Memory*,wasm::Err>)0x0;
  p_Var2 = local_48;
LAB_00bfe4e8:
  std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr
            ((unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)&local_38);
  return (Result<wasm::Memory_*> *)p_Var2;
}

Assistant:

Result<Memory*> ParseDeclsCtx::addMemoryDecl(Index pos,
                                             Name name,
                                             ImportNames* importNames,
                                             MemType type) {
  auto m = std::make_unique<Memory>();
  m->addressType = type.addressType;
  m->initial = type.limits.initial;
  m->max = type.limits.max ? *type.limits.max : Memory::kUnlimitedSize;
  m->shared = type.shared;
  if (name) {
    // TODO: if the existing memory is not explicitly named, fix its name
    // and continue.
    if (wasm.getMemoryOrNull(name)) {
      return in.err(pos, "repeated memory name");
    }
    m->setExplicitName(name);
  } else {
    name = (importNames ? "mimport$" : "") + std::to_string(memoryCounter++);
    name = Names::getValidMemoryName(wasm, name);
    m->name = name;
  }
  applyImportNames(*m, importNames);
  return wasm.addMemory(std::move(m));
}